

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

void __thiscall FSerializer::Close(FSerializer *this)

{
  FWriter *this_00;
  FReader *this_01;
  bool bVar1;
  TArray<DObject_*,_DObject_*> *this_02;
  DObject **ppDVar2;
  DThinker *pDVar3;
  DThinker *think;
  DObject **obj;
  iterator __end2;
  iterator __begin2;
  TArray<DObject_*,_DObject_*> *__range2;
  FSerializer *this_local;
  
  if (this->w != (FWriter *)0x0) {
    this_00 = this->w;
    if (this_00 != (FWriter *)0x0) {
      FWriter::~FWriter(this_00);
      operator_delete(this_00,0x78);
    }
    this->w = (FWriter *)0x0;
  }
  if (this->r != (FReader *)0x0) {
    this_02 = &this->r->mDObjects;
    __end2 = TArray<DObject_*,_DObject_*>::begin(this_02);
    obj = (DObject **)TArray<DObject_*,_DObject_*>::end(this_02);
    while (bVar1 = TIterator<DObject_*>::operator!=(&__end2,(TIterator<DObject_*> *)&obj), bVar1) {
      ppDVar2 = TIterator<DObject_*>::operator*(&__end2);
      pDVar3 = dyn_cast<DThinker>(*ppDVar2);
      if ((pDVar3 != (DThinker *)0x0) &&
         ((pDVar3->NextThinker == (DThinker *)0x0 || (pDVar3->PrevThinker == (DThinker *)0x0)))) {
        (*(pDVar3->super_DObject)._vptr_DObject[4])();
      }
      TIterator<DObject_*>::operator++(&__end2);
    }
    this_01 = this->r;
    if (this_01 != (FReader *)0x0) {
      FReader::~FReader(this_01);
      operator_delete(this_01,0xb8);
    }
    this->r = (FReader *)0x0;
  }
  if (0 < this->mErrors) {
    I_Error("%d errors parsing JSON",(ulong)(uint)this->mErrors);
  }
  return;
}

Assistant:

void FSerializer::Close()
{	
	if (w != nullptr)
	{
		delete w;
		w = nullptr;
	}
	if (r != nullptr)
	{
		// we must explicitly delete all thinkers in the array which did not get linked into the thinker lists.
		// Otherwise these objects may survive a level deletion and point to incorrect data.
		for (auto &obj : r->mDObjects)
		{
			auto think = dyn_cast<DThinker>(obj);
			if (think != nullptr)
			{
				if (think->NextThinker == nullptr || think->PrevThinker == nullptr)
				{
					think->Destroy();
				}
			}
		}

		delete r;
		r = nullptr;
	}
	if (mErrors > 0)
	{
		I_Error("%d errors parsing JSON", mErrors);
	}
}